

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::SlabAllocatorBase<0>::CopyStringIntoWLength
          (SlabAllocatorBase<0> *this,char16 *str,uint32 length,TTString *into)

{
  char16_t *pcVar1;
  TTString *into_local;
  uint32 length_local;
  char16 *str_local;
  SlabAllocatorBase<0> *this_local;
  
  if (str == (char16 *)0x0) {
    TTDAbort_unrecoverable_error("Not allowed for string + length");
  }
  into->Length = length;
  pcVar1 = SlabAllocateArray<char16_t>(this,(ulong)(into->Length + 1));
  into->Contents = pcVar1;
  js_memcpy_s(into->Contents,(ulong)into->Length << 1,str,(ulong)length << 1);
  into->Contents[into->Length] = L'\0';
  return;
}

Assistant:

void CopyStringIntoWLength(const char16* str, uint32 length, TTString& into)
        {
            TTDAssert(str != nullptr, "Not allowed for string + length");

            into.Length = length;
            into.Contents = this->SlabAllocateArray<char16>(into.Length + 1);

            //don't js_memcpy if the contents length is 0
            js_memcpy_s(into.Contents, into.Length * sizeof(char16), str, length * sizeof(char16));
            into.Contents[into.Length] = '\0';
        }